

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.cc
# Opt level: O3

void __thiscall
cnn::FastLSTMBuilder::start_new_sequence_impl
          (FastLSTMBuilder *this,
          vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *hinit)

{
  uint uVar1;
  pointer pEVar2;
  pointer pEVar3;
  pointer pEVar4;
  bool bVar5;
  long lVar6;
  uint uVar7;
  
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::clear(&this->h);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::clear(&this->c);
  lVar6 = (long)(hinit->
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(hinit->
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>).
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar6 == 0) {
    bVar5 = false;
  }
  else {
    if (lVar6 >> 4 != (ulong)(this->layers * 2)) {
      __assert_fail("layers*2 == hinit.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/fast-lstm.cc"
                    ,0x53,
                    "virtual void cnn::FastLSTMBuilder::start_new_sequence_impl(const vector<Expression> &)"
                   );
    }
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              (&this->h0,(ulong)this->layers);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              (&this->c0,(ulong)this->layers);
    uVar1 = this->layers;
    bVar5 = true;
    if ((ulong)uVar1 != 0) {
      pEVar2 = (hinit->
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pEVar3 = (this->c0).
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pEVar4 = (this->h0).
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar6 = 0;
      uVar7 = uVar1;
      do {
        *(undefined8 *)((long)&pEVar3->pg + lVar6) = *(undefined8 *)((long)&pEVar2->pg + lVar6);
        *(undefined4 *)((long)&(pEVar3->i).t + lVar6) =
             *(undefined4 *)((long)&(pEVar2->i).t + lVar6);
        *(ComputationGraph **)((long)&pEVar4->pg + lVar6) = pEVar2[uVar7].pg;
        *(uint *)((long)&(pEVar4->i).t + lVar6) = pEVar2[uVar7].i.t;
        lVar6 = lVar6 + 0x10;
        uVar7 = uVar7 + 1;
      } while ((ulong)uVar1 << 4 != lVar6);
    }
  }
  this->has_initial_state = bVar5;
  return;
}

Assistant:

void FastLSTMBuilder::start_new_sequence_impl(const vector<Expression>& hinit) {
  h.clear();
  c.clear();
  if (hinit.size() > 0) {
    assert(layers*2 == hinit.size());
    h0.resize(layers);
    c0.resize(layers);
    for (unsigned i = 0; i < layers; ++i) {
      c0[i] = hinit[i];
      h0[i] = hinit[i + layers];
    }
    has_initial_state = true;
  } else {
    has_initial_state = false;
  }
}